

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall xemmai::ast::t_block::f_use(t_block *this,size_t a_i,bool a_put)

{
  pointer ptVar1;
  
  ptVar1 = (this->v_privates).
           super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->v_privates).
                    super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar1 >> 2) < a_i + 1) {
    std::vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>::
    resize(&this->v_privates,a_i + 1);
    ptVar1 = (this->v_privates).
             super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ptVar1[a_i].v_out == false) {
    ptVar1[a_i].v_out = true;
    ptVar1[a_i].v_define = a_put;
    ptVar1[a_i].v_use = !a_put;
  }
  return;
}

Assistant:

void f_use(size_t a_i, bool a_put)
	{
		if (v_privates.size() < a_i + 1) v_privates.resize(a_i + 1);
		auto& x = v_privates[a_i];
		if (x.v_out) return;
		x.v_out = true;
		x.v_define = a_put;
		x.v_use = !a_put;
	}